

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShapeTests.cpp
# Opt level: O0

int testRangeVal(void)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  runtime_error *err_4;
  RangeValue div8;
  runtime_error *err_3;
  RangeValue div7;
  RangeValue div6;
  RangeValue div5;
  RangeValue div4;
  RangeValue div3;
  RangeValue div2;
  RangeValue div1;
  RangeValue sub12;
  RangeValue sub11;
  RangeValue sub10;
  RangeValue sub9;
  runtime_error *err_2;
  RangeValue sub8;
  runtime_error *err_1;
  RangeValue sub7;
  RangeValue sub6;
  RangeValue sub5;
  RangeValue sub4;
  RangeValue sub3;
  RangeValue sub2;
  RangeValue sub1;
  RangeValue mul4;
  RangeValue mul3;
  RangeValue mul2;
  RangeValue mul1;
  RangeValue add4;
  RangeValue add3;
  RangeValue add2;
  RangeValue add1;
  runtime_error *err;
  undefined1 local_50 [7];
  bool catch_me;
  RangeValue test4;
  RangeValue test3;
  RangeValue test2;
  RangeValue test1;
  
  CoreML::RangeValue::RangeValue((RangeValue *)&test2._val);
  bVar1 = CoreML::RangeValue::isUnbound((RangeValue *)&test2._val);
  if (bVar1) {
    CoreML::RangeValue::RangeValue((RangeValue *)&test3._val,2);
    bVar1 = CoreML::RangeValue::operator>((RangeValue *)&test2._val,(RangeValue *)&test3._val);
    if (bVar1) {
      bVar1 = CoreML::RangeValue::operator>=((RangeValue *)&test2._val,(RangeValue *)&test3._val);
      if (bVar1) {
        bVar1 = CoreML::RangeValue::operator<((RangeValue *)&test3._val,(RangeValue *)&test2._val);
        if (bVar1) {
          bVar1 = CoreML::RangeValue::operator<=
                            ((RangeValue *)&test3._val,(RangeValue *)&test2._val);
          if (bVar1) {
            bVar1 = CoreML::RangeValue::operator>((RangeValue *)&test2._val,2);
            if (bVar1) {
              bVar1 = CoreML::RangeValue::operator>=((RangeValue *)&test2._val,2);
              if (bVar1) {
                bVar1 = CoreML::RangeValue::operator<((RangeValue *)&test2._val,6);
                if (bVar1) {
                  poVar2 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                          );
                  poVar2 = std::operator<<(poVar2,":");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21);
                  poVar2 = std::operator<<(poVar2,": error: ");
                  poVar2 = std::operator<<(poVar2,"!(test1 < 6)");
                  poVar2 = std::operator<<(poVar2," was false, expected true.");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                }
                else {
                  bVar1 = CoreML::RangeValue::operator<=((RangeValue *)&test2._val,6);
                  if (bVar1) {
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                            );
                    poVar2 = std::operator<<(poVar2,":");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22);
                    poVar2 = std::operator<<(poVar2,": error: ");
                    poVar2 = std::operator<<(poVar2,"!(test1 <= 6)");
                    poVar2 = std::operator<<(poVar2," was false, expected true.");
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  }
                  else {
                    CoreML::RangeValue::RangeValue((RangeValue *)&test4._val,3);
                    bVar1 = CoreML::RangeValue::operator>
                                      ((RangeValue *)&test4._val,(RangeValue *)&test3._val);
                    if (bVar1) {
                      bVar1 = CoreML::RangeValue::operator>=
                                        ((RangeValue *)&test4._val,(RangeValue *)&test3._val);
                      if (bVar1) {
                        bVar1 = CoreML::RangeValue::operator<
                                          ((RangeValue *)&test3._val,(RangeValue *)&test4._val);
                        if (bVar1) {
                          bVar1 = CoreML::RangeValue::operator<=
                                            ((RangeValue *)&test3._val,(RangeValue *)&test4._val);
                          if (bVar1) {
                            bVar1 = CoreML::RangeValue::operator<((RangeValue *)&test3._val,3);
                            if (bVar1) {
                              bVar1 = CoreML::RangeValue::operator<=((RangeValue *)&test3._val,3);
                              if (bVar1) {
                                bVar1 = CoreML::RangeValue::operator>((RangeValue *)&test3._val,1);
                                if (bVar1) {
                                  bVar1 = CoreML::RangeValue::operator>=
                                                    ((RangeValue *)&test3._val,1);
                                  if (bVar1) {
                                    bVar1 = CoreML::RangeValue::operator>=
                                                      ((RangeValue *)&test3._val,2);
                                    if (bVar1) {
                                      CoreML::RangeValue::RangeValue((RangeValue *)local_50);
                                      bVar1 = CoreML::RangeValue::operator>
                                                        ((RangeValue *)local_50,
                                                         (RangeValue *)&test2._val);
                                      if (bVar1) {
                                        bVar1 = CoreML::RangeValue::operator>
                                                          ((RangeValue *)&test2._val,
                                                           (RangeValue *)local_50);
                                        if (bVar1) {
                                          bVar1 = CoreML::RangeValue::operator<
                                                            ((RangeValue *)local_50,
                                                             (RangeValue *)&test2._val);
                                          if (bVar1) {
                                            poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                            poVar2 = std::operator<<(poVar2,":");
                                            poVar2 = (ostream *)
                                                     std::ostream::operator<<(poVar2,0x36);
                                            poVar2 = std::operator<<(poVar2,": error: ");
                                            poVar2 = std::operator<<(poVar2,"!(test4 < test1)");
                                            poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                            std::ostream::operator<<
                                                      (poVar2,std::endl<char,std::char_traits<char>>
                                                      );
                                          }
                                          else {
                                            bVar1 = CoreML::RangeValue::operator<
                                                              ((RangeValue *)&test2._val,
                                                               (RangeValue *)local_50);
                                            if (bVar1) {
                                              poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                              poVar2 = std::operator<<(poVar2,":");
                                              poVar2 = (ostream *)
                                                       std::ostream::operator<<(poVar2,0x37);
                                              poVar2 = std::operator<<(poVar2,": error: ");
                                              poVar2 = std::operator<<(poVar2,"!(test1 < test4)");
                                              poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                              std::ostream::operator<<
                                                        (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                            }
                                            else {
                                              bVar1 = CoreML::RangeValue::operator>=
                                                                ((RangeValue *)local_50,
                                                                 (RangeValue *)&test2._val);
                                              if (bVar1) {
                                                bVar1 = CoreML::RangeValue::operator>=
                                                                  ((RangeValue *)&test2._val,
                                                                   (RangeValue *)local_50);
                                                if (bVar1) {
                                                  bVar1 = CoreML::RangeValue::operator<=
                                                                    ((RangeValue *)local_50,
                                                                     (RangeValue *)&test2._val);
                                                  if (bVar1) {
                                                    bVar1 = CoreML::RangeValue::operator<=
                                                                      ((RangeValue *)&test2._val,
                                                                       (RangeValue *)local_50);
                                                    if (bVar1) {
                                                      sVar3 = CoreML::RangeValue::value
                                                                        ((RangeValue *)&test3._val);
                                                      if (sVar3 == 2) {
                                                        CoreML::RangeValue::value
                                                                  ((RangeValue *)&test2._val);
                                                        poVar2 = std::operator<<((ostream *)
                                                                                 &std::cout,
                                                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                                  poVar2 = std::operator<<(poVar2,":");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,0x43);
                                                  poVar2 = std::operator<<(poVar2,": error: ");
                                                  poVar2 = std::operator<<(poVar2,"0");
                                                  poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                                  std::ostream::operator<<
                                                            (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                                  }
                                                  else {
                                                    poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                                  poVar2 = std::operator<<(poVar2,":");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,0x3f);
                                                  poVar2 = std::operator<<(poVar2,": error: ");
                                                  poVar2 = std::operator<<(poVar2,
                                                  "test2.value() == 2");
                                                  poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                                  std::ostream::operator<<
                                                            (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                                  }
                                                  }
                                                  else {
                                                    poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                                  poVar2 = std::operator<<(poVar2,":");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,0x3c);
                                                  poVar2 = std::operator<<(poVar2,": error: ");
                                                  poVar2 = std::operator<<(poVar2,"test1 <= test4");
                                                  poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                                  std::ostream::operator<<
                                                            (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                                  }
                                                  }
                                                  else {
                                                    poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                                  poVar2 = std::operator<<(poVar2,":");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,0x3b);
                                                  poVar2 = std::operator<<(poVar2,": error: ");
                                                  poVar2 = std::operator<<(poVar2,"test4 <= test1");
                                                  poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                                  std::ostream::operator<<
                                                            (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                                  }
                                                }
                                                else {
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                                  poVar2 = std::operator<<(poVar2,":");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,0x3a);
                                                  poVar2 = std::operator<<(poVar2,": error: ");
                                                  poVar2 = std::operator<<(poVar2,"test1 >= test4");
                                                  poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                                  std::ostream::operator<<
                                                            (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                                }
                                              }
                                              else {
                                                poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                                poVar2 = std::operator<<(poVar2,":");
                                                poVar2 = (ostream *)
                                                         std::ostream::operator<<(poVar2,0x39);
                                                poVar2 = std::operator<<(poVar2,": error: ");
                                                poVar2 = std::operator<<(poVar2,"test4 >= test1");
                                                poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                                std::ostream::operator<<
                                                          (poVar2,std::
                                                  endl<char,std::char_traits<char>>);
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                          poVar2 = std::operator<<(poVar2,":");
                                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
                                          poVar2 = std::operator<<(poVar2,": error: ");
                                          poVar2 = std::operator<<(poVar2,"test1 > test4");
                                          poVar2 = std::operator<<(poVar2,
                                                  " was false, expected true.");
                                          std::ostream::operator<<
                                                    (poVar2,std::endl<char,std::char_traits<char>>);
                                        }
                                      }
                                      else {
                                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                        poVar2 = std::operator<<(poVar2,":");
                                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x34);
                                        poVar2 = std::operator<<(poVar2,": error: ");
                                        poVar2 = std::operator<<(poVar2,"test4 > test1");
                                        poVar2 = std::operator<<(poVar2," was false, expected true."
                                                                );
                                        std::ostream::operator<<
                                                  (poVar2,std::endl<char,std::char_traits<char>>);
                                      }
                                    }
                                    else {
                                      poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                      poVar2 = std::operator<<(poVar2,":");
                                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f);
                                      poVar2 = std::operator<<(poVar2,": error: ");
                                      poVar2 = std::operator<<(poVar2,"test2 >= 2");
                                      poVar2 = std::operator<<(poVar2," was false, expected true.");
                                      std::ostream::operator<<
                                                (poVar2,std::endl<char,std::char_traits<char>>);
                                    }
                                  }
                                  else {
                                    poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                    poVar2 = std::operator<<(poVar2,":");
                                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
                                    poVar2 = std::operator<<(poVar2,": error: ");
                                    poVar2 = std::operator<<(poVar2,"test2 >= 1");
                                    poVar2 = std::operator<<(poVar2," was false, expected true.");
                                    std::ostream::operator<<
                                              (poVar2,std::endl<char,std::char_traits<char>>);
                                  }
                                }
                                else {
                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2d);
                                  poVar2 = std::operator<<(poVar2,": error: ");
                                  poVar2 = std::operator<<(poVar2,"test2 > 1");
                                  poVar2 = std::operator<<(poVar2," was false, expected true.");
                                  std::ostream::operator<<
                                            (poVar2,std::endl<char,std::char_traits<char>>);
                                }
                              }
                              else {
                                poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                                poVar2 = std::operator<<(poVar2,":");
                                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2c);
                                poVar2 = std::operator<<(poVar2,": error: ");
                                poVar2 = std::operator<<(poVar2,"test2 <= 3");
                                poVar2 = std::operator<<(poVar2," was false, expected true.");
                                std::ostream::operator<<
                                          (poVar2,std::endl<char,std::char_traits<char>>);
                              }
                            }
                            else {
                              poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                              poVar2 = std::operator<<(poVar2,":");
                              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2b);
                              poVar2 = std::operator<<(poVar2,": error: ");
                              poVar2 = std::operator<<(poVar2,"test2 < 3");
                              poVar2 = std::operator<<(poVar2," was false, expected true.");
                              std::ostream::operator<<
                                        (poVar2,std::endl<char,std::char_traits<char>>);
                            }
                          }
                          else {
                            poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                            poVar2 = std::operator<<(poVar2,":");
                            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x29);
                            poVar2 = std::operator<<(poVar2,": error: ");
                            poVar2 = std::operator<<(poVar2,"test2 <= test3");
                            poVar2 = std::operator<<(poVar2," was false, expected true.");
                            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                          }
                        }
                        else {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  );
                          poVar2 = std::operator<<(poVar2,":");
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x28);
                          poVar2 = std::operator<<(poVar2,": error: ");
                          poVar2 = std::operator<<(poVar2,"test2 < test3");
                          poVar2 = std::operator<<(poVar2," was false, expected true.");
                          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        }
                      }
                      else {
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                );
                        poVar2 = std::operator<<(poVar2,":");
                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x27);
                        poVar2 = std::operator<<(poVar2,": error: ");
                        poVar2 = std::operator<<(poVar2,"test3 >= test2");
                        poVar2 = std::operator<<(poVar2," was false, expected true.");
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      }
                    }
                    else {
                      poVar2 = std::operator<<((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                              );
                      poVar2 = std::operator<<(poVar2,":");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x26);
                      poVar2 = std::operator<<(poVar2,": error: ");
                      poVar2 = std::operator<<(poVar2,"test3 > test2");
                      poVar2 = std::operator<<(poVar2," was false, expected true.");
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    }
                  }
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                        );
                poVar2 = std::operator<<(poVar2,":");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f);
                poVar2 = std::operator<<(poVar2,": error: ");
                poVar2 = std::operator<<(poVar2,"test1 >= 2");
                poVar2 = std::operator<<(poVar2," was false, expected true.");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e);
              poVar2 = std::operator<<(poVar2,": error: ");
              poVar2 = std::operator<<(poVar2,"test1 > 2");
              poVar2 = std::operator<<(poVar2," was false, expected true.");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1c);
            poVar2 = std::operator<<(poVar2,": error: ");
            poVar2 = std::operator<<(poVar2,"test2 <= test1");
            poVar2 = std::operator<<(poVar2," was false, expected true.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1b);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"test2 < test1");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"test1 >= test2");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"test1 > test2");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x15);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"test1.isUnbound()");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return 1;
}

Assistant:

int testRangeVal() {

    // Unbound constructor
    RangeValue test1 = RangeValue();
    ML_ASSERT(test1.isUnbound());

    // Relations between set and unbound
    RangeValue test2 = RangeValue(2);
    ML_ASSERT(test1 > test2);
    ML_ASSERT(test1 >= test2);
    ML_ASSERT(test2 < test1);
    ML_ASSERT(test2 <= test1);

    ML_ASSERT(test1 > 2);
    ML_ASSERT(test1 >= 2);

    ML_ASSERT(!(test1 < 6));
    ML_ASSERT(!(test1 <= 6));

    // Relations between two set values
    RangeValue test3 = RangeValue(3);
    ML_ASSERT(test3 > test2);
    ML_ASSERT(test3 >= test2);
    ML_ASSERT(test2 < test3);
    ML_ASSERT(test2 <= test3);

    ML_ASSERT(test2 < 3);
    ML_ASSERT(test2 <= 3);
    ML_ASSERT(test2 > 1);
    ML_ASSERT(test2 >= 1);
    ML_ASSERT(test2 >= 2);


    // Test two unbound values
    RangeValue test4 = RangeValue();
    ML_ASSERT(test4 > test1);
    ML_ASSERT(test1 > test4);
    ML_ASSERT(!(test4 < test1));
    ML_ASSERT(!(test1 < test4));

    ML_ASSERT(test4 >= test1);
    ML_ASSERT(test1 >= test4);
    ML_ASSERT(test4 <= test1);
    ML_ASSERT(test1 <= test4);


    ML_ASSERT(test2.value() == 2);
    bool catch_me = false;
    try {
        test1.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        // this should throw, so we're ok -- this is a pass
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    // Test arithmetic
    RangeValue add1 = test1 + test2;
    ML_ASSERT(add1.isUnbound());
    RangeValue add2 = test2 + test3;
    ML_ASSERT(add2.value() == 5);
    RangeValue add3 = test1 + 4;
    ML_ASSERT(add3.isUnbound());
    RangeValue add4 = test2 + 4;
    ML_ASSERT(add4.value() == 6);

    RangeValue mul1 = test1 * test2;
    ML_ASSERT(mul1.isUnbound());
    RangeValue mul2 = test2 * test3;
    ML_ASSERT(mul2.value() == 6);
    RangeValue mul3 = test1 * 4;
    ML_ASSERT(mul3.isUnbound());
    RangeValue mul4 = test2 * 4;
    ML_ASSERT(mul4.value() == 8);

    RangeValue sub1 = test1 - test2;
    ML_ASSERT(sub1.isUnbound());
    RangeValue sub2 = test2 - test3;
    ML_ASSERT(sub2.value() == 0);
    RangeValue sub3 = test1 - 4;
    ML_ASSERT(sub3.isUnbound());
    RangeValue sub4 = test2 - 4;
    ML_ASSERT(sub4.value() == 0);
    RangeValue sub5 = test3 - test2;
    ML_ASSERT(sub5.value() == 1);
    RangeValue sub6 = test3 - 1;
    ML_ASSERT(sub6.value() == 2);

    catch_me = false;
    try {
        RangeValue sub7 = test2 - test1;
        sub7.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    catch_me = false;
    try {
        RangeValue sub8 = test4 - test1;
        sub8.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    RangeValue sub9 = test1 - -5;
    ML_ASSERT(sub9.isUnbound());
    RangeValue sub10 = test2 - -1;
    ML_ASSERT(sub10.value() == 3);
    RangeValue sub11 = test1 - 50;
    ML_ASSERT(sub11.isUnbound());
    RangeValue sub12 = test2 - 50;
    ML_ASSERT(sub12.value() == 0);

    RangeValue div1 = test1 / test2;
    ML_ASSERT(div1.isUnbound());
    RangeValue div2 = test2 / test3;
    ML_ASSERT(div2.value() == 0);
    RangeValue div3 = test1 / 4;
    ML_ASSERT(div3.isUnbound());
    RangeValue div4 = RangeValue(10) / 2;
    ML_ASSERT(div4.value() == 5);
    RangeValue div5 = test3 / test2;
    ML_ASSERT(div5.value() == 1);
    RangeValue div6 = test3 / 1;
    ML_ASSERT(div6.value() == 3);

    catch_me = false;
    try {
        RangeValue div7 = test2 / test1;
        div7.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    catch_me = false;
    try {
        RangeValue div8 = test4 / test1;
        div8.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    test1.set(10);
    ML_ASSERT(!test1.isUnbound());
    ML_ASSERT(test1.value() == 10);
    test2.set(test3);
    ML_ASSERT(!test2.isUnbound());
    ML_ASSERT(test2.value() == 3);

    return 0;
}